

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<unsigned_int,_false,_false>::grow_and_add
          (FastVector<unsigned_int,_false,_false> *this,uint newSize,uint *val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *ptr;
  uint oldMax;
  uint *oldData;
  uint *val_local;
  uint newSize_local;
  FastVector<unsigned_int,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  uVar2 = *val;
  uVar3 = this->count;
  this->count = uVar3 + 1;
  this->data[uVar3] = uVar2;
  if (ptr != (uint *)0x0) {
    NULLC::destruct<unsigned_int>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}